

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arun.cpp
# Opt level: O2

rotation_t * opengv::math::arun(rotation_t *__return_storage_ptr__,MatrixXd *Hcross)

{
  Scalar SVar1;
  undefined1 local_388 [16];
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *local_378;
  variable_if_dynamic<long,__1> local_370;
  variable_if_dynamic<long,__1> vStack_368;
  Index local_360;
  Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> local_350;
  Matrix3d V_prime;
  Matrix3d V;
  Matrix3d U;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDcross;
  
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD(&SVDcross,Hcross,0x14);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&V,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             &SVDcross.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
              .m_matrixV);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&U,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&SVDcross);
  V_prime.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&V;
  V_prime.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&U;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)__return_storage_ptr__,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
              *)&V_prime);
  SVar1 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3>::run
                    (__return_storage_ptr__);
  if (SVar1 < 0.0) {
    local_370.m_value = 0;
    vStack_368.m_value = 0;
    local_360 = 3;
    local_350.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_startRow.m_value
         = 0;
    local_350.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_startCol.m_value
         = 0;
    local_350.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_outerStride = 3;
    local_388._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&V;
    local_378 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&V;
    local_350.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>.m_data =
         (PointerType)&V_prime;
    local_350.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_xpr =
         (XprTypeNested)&V_prime;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
              (&local_350,(Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)local_388);
    local_388._0_8_ =
         V.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 3;
    local_370.m_value = 0;
    local_350.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>.m_data =
         V_prime.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
         + 3;
    vStack_368.m_value = 1;
    local_360 = 3;
    local_350.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_startRow.m_value
         = 0;
    local_350.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_startCol.m_value
         = 1;
    local_350.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_outerStride = 3;
    local_378 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&V;
    local_350.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_xpr =
         (XprTypeNested)&V_prime;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
              (&local_350,(Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)local_388);
    local_388._0_8_ =
         V.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 6;
    local_370.m_value = 0;
    local_350.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>.m_data =
         V_prime.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
         + 6;
    vStack_368.m_value = 2;
    local_360 = 3;
    local_350.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_startRow.m_value
         = 0;
    local_350.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_startCol.m_value
         = 2;
    local_350.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_outerStride = 3;
    local_378 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&V;
    local_350.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_xpr =
         (XprTypeNested)&V_prime;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>const>>
              (&local_350,
               (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                *)local_388);
    local_388._0_8_ =
         (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
          *)&V_prime;
    local_388._8_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&U;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
              (__return_storage_ptr__,
               (Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
                *)local_388);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&SVDcross);
  return __return_storage_ptr__;
}

Assistant:

opengv::rotation_t
opengv::math::arun( const Eigen::MatrixXd & Hcross )
{
  //decompose matrix H to obtain rotation
  Eigen::JacobiSVD< Eigen::MatrixXd > SVDcross(
      Hcross,
      Eigen::ComputeFullU | Eigen::ComputeFullV );

  Eigen::Matrix3d V = SVDcross.matrixV();
  Eigen::Matrix3d U = SVDcross.matrixU();
  rotation_t R = V * U.transpose();

  //modify the result in case the rotation has determinant=-1
  if( R.determinant() < 0 )
  {
    Eigen::Matrix3d V_prime;
    V_prime.col(0) = V.col(0);
    V_prime.col(1) = V.col(1);
    V_prime.col(2) = -V.col(2);
    R = V_prime * U.transpose();
  }

  return R;
}